

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O0

Nonnull<std::string_*>
absl::lts_20240722::status_internal::MakeCheckFailString_abi_cxx11_
          (Nonnull<const_absl::Status_*> status,Nonnull<const_char_*> prefix)

{
  AlphaNum *pAVar1;
  AlphaNum local_108;
  string local_d8;
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_48;
  Nullable<const_char_*> local_18;
  Nonnull<const_char_*> prefix_local;
  Nonnull<const_absl::Status_*> status_local;
  
  local_18 = prefix;
  prefix_local = (Nonnull<const_char_*>)status;
  pAVar1 = (AlphaNum *)operator_new(0x20);
  AlphaNum::AlphaNum(&local_48,local_18);
  AlphaNum::AlphaNum(&local_88," (");
  Status::ToString_abi_cxx11_(&local_d8,(Status *)prefix_local,kWithEverything);
  AlphaNum::AlphaNum<std::allocator<char>>(&local_b8,&local_d8);
  AlphaNum::AlphaNum(&local_108,")");
  absl::lts_20240722::StrCat_abi_cxx11_(pAVar1,&local_48,&local_88,&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  return (Nonnull<std::string_*>)pAVar1;
}

Assistant:

absl::Nonnull<std::string*> MakeCheckFailString(
    absl::Nonnull<const absl::Status*> status,
    absl::Nonnull<const char*> prefix) {
  return new std::string(
      absl::StrCat(prefix, " (",
                   status->ToString(StatusToStringMode::kWithEverything), ")"));
}